

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScsClient.cpp
# Opt level: O3

void __thiscall Scs::Client::~Client(Client *this)

{
  _Manager_type p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  (this->super_IClient)._vptr_IClient = (_func_int **)&PTR__Client_0011c920;
  LOCK();
  (this->m_status)._M_i = Shutdown;
  UNLOCK();
  if ((this->m_thread)._M_id._M_thread != 0) {
    std::thread::join();
  }
  std::
  deque<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>,_Scs::Allocator<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>_>_>
  ::~deque(&(this->m_sendQueue).m_queue);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Scs::Allocator<char>_>::_M_dispose
            (&this->m_address);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Scs::Allocator<char>_>::_M_dispose
            (&this->m_port);
  p_Var1 = (this->m_onUpdate).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->m_onUpdate,(_Any_data *)&this->m_onUpdate,__destroy_functor);
  }
  p_Var1 = (this->m_onReceiveData).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->m_onReceiveData,(_Any_data *)&this->m_onReceiveData,
              __destroy_functor);
  }
  p_Var1 = (this->m_onDisconnect).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->m_onDisconnect,(_Any_data *)&this->m_onDisconnect,
              __destroy_functor);
  }
  p_Var1 = (this->m_onConnect).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->m_onConnect,(_Any_data *)&this->m_onConnect,__destroy_functor);
  }
  if ((this->m_thread)._M_id._M_thread == 0) {
    this_00 = (this->m_socket).super___shared_ptr<Scs::Socket,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      return;
    }
    return;
  }
  std::terminate();
}

Assistant:

Client::~Client()
{
	m_status = Status::Shutdown;
	if (m_thread.joinable())
		m_thread.join();
}